

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

bool google::protobuf::compiler::js::anon_unknown_0::HasRepeatedFields
               (GeneratorOptions *options,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  Descriptor *in_RSI;
  int i;
  int iVar3;
  int index;
  
  iVar3 = 0;
  do {
    index = iVar3;
    iVar2 = Descriptor::field_count(in_RSI);
    if (iVar2 <= iVar3) {
      return false;
    }
    Descriptor::field(in_RSI,index);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x4684b8);
    if (bVar1) {
      Descriptor::field(in_RSI,index);
      bVar1 = FieldDescriptor::is_map((FieldDescriptor *)CONCAT44(index,iVar3));
      if (!bVar1) {
        return true;
      }
    }
    iVar3 = index + 1;
  } while( true );
}

Assistant:

bool HasRepeatedFields(const GeneratorOptions& options,
                       const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); i++) {
    if (desc->field(i)->is_repeated() && !desc->field(i)->is_map()) {
      return true;
    }
  }
  return false;
}